

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.h
# Opt level: O1

void __thiscall
chrono::ChLoadBodyTorque::ChLoadBodyTorque(ChLoadBodyTorque *this,ChLoadBodyTorque *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  ChObj::ChObj((ChObj *)this,(ChObj *)param_1);
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBase_00b48a58;
  (this->super_ChLoadCustom).super_ChLoadBase.jacobians =
       (param_1->super_ChLoadCustom).super_ChLoadBase.jacobians;
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_00b48b10;
  (this->super_ChLoadCustom).loadable.
  super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->super_ChLoadCustom).loadable.
       super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (param_1->super_ChLoadCustom).loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_ChLoadCustom).loadable.
  super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&(this->super_ChLoadCustom).load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)&(param_1->super_ChLoadCustom).load_Q);
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyTorque_00b48d98;
  (this->m_torque).m_data[0] = (param_1->m_torque).m_data[0];
  (this->m_torque).m_data[1] = (param_1->m_torque).m_data[1];
  (this->m_torque).m_data[2] = (param_1->m_torque).m_data[2];
  this->m_local_torque = param_1->m_local_torque;
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (param_1->m_modulation).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->m_scale = param_1->m_scale;
  return;
}

Assistant:

class ChApi ChLoadBodyTorque : public ChLoadCustom {
  public:
    ChLoadBodyTorque(std::shared_ptr<ChBody> body,  ///< object to apply load to
                     const ChVector<>& torque,      ///< torque to apply
                     bool local_torque              ///< torque is in body local coords
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadBodyTorque* Clone() const override { return new ChLoadBodyTorque(*this); }

    /// Set the constant torque vector.
    /// This value is optionally modulated by a function of time.
    void SetTorque(const ChVector<>& torque, bool is_local);

    /// Return the current torque vector (scaled by the current modulation value).
    ChVector<> GetTorque() const;

    /// Set modulation function.
    /// This is a function of time which (optionally) modulates the specified applied force.
    /// By default the modulation is a constant function, always returning a value of 1.
    void SetModulationFunction(std::shared_ptr<ChFunction> modulation) { m_modulation = modulation; }

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;

  private:
    ChVector<> m_torque;  ///< base torque value
    bool m_local_torque;  ///< is torque expressed in local frame?

    std::shared_ptr<ChFunction> m_modulation;  ///< modulation function of time
    double m_scale;                            ///< scaling factor (current modulation value)

    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;
}